

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  short sVar2;
  undefined4 uVar3;
  ImVec2 IVar4;
  bool bVar5;
  ImGuiNextItemDataFlags IVar6;
  ImGuiContext *pIVar7;
  ImGuiCond IVar8;
  bool bVar9;
  ImU32 IVar10;
  int iVar11;
  ImU32 id_00;
  char *pcVar12;
  uint in_ECX;
  byte *in_RDX;
  bool *in_RSI;
  ImGuiTabBar *in_RDI;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  ImVec2 IVar17;
  ImVec2 IVar18;
  ImVec2 IVar19;
  bool text_clipped;
  bool just_closed;
  ImGuiID close_button_id;
  bool hovered_unblocked;
  ImU32 tab_col;
  ImDrawList *display_draw_list;
  bool pressed;
  bool held;
  bool hovered;
  ImGuiButtonFlags button_flags;
  ImVec2 backup_cursor_max_pos;
  bool want_clip_rect;
  ImRect bb;
  ImVec2 pos;
  bool is_central_section;
  ImVec2 backup_main_cursor_pos;
  bool tab_contents_visible;
  bool is_tab_button;
  bool tab_just_unsaved;
  bool tab_appearing;
  bool tab_bar_focused;
  bool tab_bar_appearing;
  ImVec2 size;
  bool tab_is_new;
  ImGuiTabItem *tab;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiNextItemData backup_next_item_data;
  ImGuiContext *g;
  undefined4 in_stack_fffffffffffffdf8;
  float in_stack_fffffffffffffdfc;
  ImGuiTabItem *in_stack_fffffffffffffe00;
  ImGuiMouseButton button;
  ImGuiTabBar *in_stack_fffffffffffffe08;
  float in_stack_fffffffffffffe10;
  ImGuiID in_stack_fffffffffffffe14;
  ImRect *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  ImGuiID in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  undefined2 in_stack_fffffffffffffe2c;
  undefined1 in_stack_fffffffffffffe2e;
  undefined1 in_stack_fffffffffffffe2f;
  undefined1 uVar20;
  ImGuiTabItem *in_stack_fffffffffffffe30;
  ImGuiTabBar *in_stack_fffffffffffffe38;
  ImVec2 in_stack_fffffffffffffe40;
  bool *pbVar21;
  ImGuiButtonFlags flags_00;
  undefined7 in_stack_fffffffffffffe68;
  byte bVar22;
  bool *out_hovered;
  undefined4 in_stack_fffffffffffffe7c;
  ImGuiID IVar23;
  ImGuiTabBar *in_stack_fffffffffffffe80;
  byte local_16e;
  byte local_16d;
  ImGuiNavHighlightFlags in_stack_fffffffffffffe98;
  ImDrawList *bb_00;
  ImVec2 in_stack_fffffffffffffea8;
  ImVec2 in_stack_fffffffffffffeb0;
  byte local_146;
  byte local_145;
  ImVec2 local_12c;
  ImVec2 local_124;
  byte is_contents_visible;
  float in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  float local_108;
  float in_stack_fffffffffffffefc;
  ImDrawList *in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  ImVec2 local_e4;
  float local_dc;
  float in_stack_ffffffffffffff28;
  ImGuiID in_stack_ffffffffffffff2c;
  uint uVar24;
  float local_b0;
  ImGuiTabItem *local_78;
  ImGuiTabBar *in_stack_ffffffffffffffb0;
  ImGuiWindow *pIVar25;
  bool local_34;
  uint local_24;
  byte *local_20;
  bool local_1;
  
  pIVar7 = GImGui;
  if ((in_RDI->WantLayout & 1U) != 0) {
    IVar6 = (GImGui->NextItemData).Flags;
    fVar16 = (GImGui->NextItemData).Width;
    IVar23 = (GImGui->NextItemData).FocusScopeId;
    IVar8 = (GImGui->NextItemData).OpenCond;
    uVar3 = *(undefined4 *)&(GImGui->NextItemData).OpenVal;
    TabBarLayout(in_stack_ffffffffffffffb0);
    (pIVar7->NextItemData).Flags = IVar6;
    (pIVar7->NextItemData).Width = fVar16;
    (pIVar7->NextItemData).FocusScopeId = IVar23;
    (pIVar7->NextItemData).OpenCond = IVar8;
    local_34 = SUB41(uVar3,0);
    (pIVar7->NextItemData).OpenVal = local_34;
  }
  pIVar25 = pIVar7->CurrentWindow;
  if ((pIVar25->SkipItems & 1U) == 0) {
    IVar10 = TabBarCalcTabID(in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00);
    if ((in_RDX == (byte *)0x0) || ((*in_RDX & 1) != 0)) {
      local_24 = in_ECX;
      if ((in_ECX & 0x100000) == 0) {
        local_20 = in_RDX;
        if (in_RDX == (byte *)0x0) {
          local_24 = in_ECX | 0x100000;
        }
      }
      else {
        local_20 = (byte *)0x0;
      }
      local_78 = TabBarFindTabByID((ImGuiTabBar *)
                                   CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),0);
      bVar13 = local_78 == (ImGuiTabItem *)0x0;
      if (bVar13) {
        in_stack_fffffffffffffe80 = in_RDI;
        ImGuiTabItem::ImGuiTabItem(in_stack_fffffffffffffe00);
        ImVector<ImGuiTabItem>::push_back
                  ((ImVector<ImGuiTabItem> *)in_stack_fffffffffffffe00,
                   (ImGuiTabItem *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        local_78 = ImVector<ImGuiTabItem>::back(&in_RDI->Tabs);
        local_78->ID = IVar10;
        in_RDI->TabsAddedNew = true;
      }
      iVar11 = ImVector<ImGuiTabItem>::index_from_ptr(&in_RDI->Tabs,local_78);
      in_RDI->LastTabItemIdx = (ImS16)iVar11;
      IVar23 = CONCAT13(1,(int3)in_stack_fffffffffffffe7c);
      if (local_20 == (byte *)0x0) {
        IVar23 = CONCAT13((local_24 & 1) != 0,(int3)in_stack_fffffffffffffe7c);
      }
      out_hovered = in_RSI;
      IVar17 = TabItemCalcSize((char *)in_stack_fffffffffffffe18,
                               SUB41(in_stack_fffffffffffffe14 >> 0x18,0));
      local_b0 = IVar17.x;
      local_78->RequestedWidth = -1.0;
      if (((pIVar7->NextItemData).Flags & 1U) != 0) {
        local_b0 = (pIVar7->NextItemData).Width;
        local_78->RequestedWidth = local_b0;
      }
      if (bVar13) {
        fVar16 = ImMax<float>(1.0,local_b0);
        local_78->Width = fVar16;
      }
      local_78->ContentWidth = local_b0;
      sVar2 = in_RDI->TabsActiveCount;
      in_RDI->TabsActiveCount = sVar2 + 1;
      local_78->BeginOrder = sVar2;
      bVar9 = in_RDI->PrevFrameVisible + 1 < pIVar7->FrameCount;
      bVar14 = (in_RDI->Flags & 0x200000U) != 0;
      bVar5 = local_78->LastFrameVisible + 1 < pIVar7->FrameCount;
      bVar22 = 0;
      if ((local_24 & 1) != 0) {
        bVar22 = (local_78->Flags & 1U) != 0 ^ 0xff;
      }
      bVar15 = (local_24 & 0x200000) == 0;
      local_78->LastFrameVisible = pIVar7->FrameCount;
      local_78->Flags = local_24;
      iVar11 = ImGuiTextBuffer::size(&in_RDI->TabsNames);
      local_78->NameOffset = iVar11;
      pbVar21 = in_RSI;
      strlen(in_RSI);
      flags_00 = (ImGuiButtonFlags)((ulong)pbVar21 >> 0x20);
      ImGuiTextBuffer::append
                ((ImGuiTextBuffer *)in_stack_fffffffffffffe30,
                 (char *)CONCAT17(in_stack_fffffffffffffe2f,
                                  CONCAT16(in_stack_fffffffffffffe2e,
                                           CONCAT24(in_stack_fffffffffffffe2c,
                                                    in_stack_fffffffffffffe28))),
                 (char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      if (bVar15) {
        if ((((bVar5) && ((in_RDI->Flags & 2U) != 0)) && (in_RDI->NextSelectedTabId == 0)) &&
           ((!bVar9 || (in_RDI->SelectedTabId == 0)))) {
          in_RDI->NextSelectedTabId = IVar10;
        }
        if (((local_24 & 2) != 0) && (in_RDI->SelectedTabId != IVar10)) {
          in_RDI->NextSelectedTabId = IVar10;
        }
      }
      local_1 = in_RDI->VisibleTabId == IVar10;
      if (local_1) {
        in_RDI->VisibleTabWasSubmitted = true;
      }
      else if ((((in_RDI->SelectedTabId == 0) && (bVar9)) && ((in_RDI->Tabs).Size == 1)) &&
              ((in_RDI->Flags & 2U) == 0)) {
        local_1 = true;
      }
      if ((!bVar5) || ((bVar9 && (!bVar13)))) {
        if (in_RDI->SelectedTabId == IVar10) {
          local_78->LastFrameSelected = pIVar7->FrameCount;
        }
        IVar17 = (pIVar25->DC).CursorPos;
        bVar13 = (local_78->Flags & 0xc0U) == 0;
        uVar24 = CONCAT13(bVar13,(int3)in_stack_ffffffffffffff2c);
        if (bVar13) {
          in_stack_fffffffffffffe40 = (ImVec2)&in_RDI->BarRect;
          ImVec2::ImVec2(&local_e4,(float)(int)(local_78->Offset - in_RDI->ScrollingAnim),0.0);
          IVar18 = ::operator+((ImVec2 *)
                               CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                               (ImVec2 *)0x50cb9b);
          local_dc = IVar18.x;
          in_stack_ffffffffffffff28 = IVar18.y;
          (pIVar25->DC).CursorPos = IVar18;
        }
        else {
          in_stack_fffffffffffffe30 = (ImGuiTabItem *)&in_RDI->BarRect;
          in_stack_fffffffffffffe38 = (ImGuiTabBar *)&stack0xffffffffffffff0c;
          ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffe38,local_78->Offset,0.0);
          IVar18 = ::operator+((ImVec2 *)
                               CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                               (ImVec2 *)0x50cbff);
          in_stack_ffffffffffffff14 = IVar18.x;
          (pIVar25->DC).CursorPos = IVar18;
        }
        IVar18 = (pIVar25->DC).CursorPos;
        IVar19 = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8)
                             ,(ImVec2 *)0x50cc4b);
        ImRect::ImRect((ImRect *)&stack0xfffffffffffffef0,(ImVec2 *)&stack0xffffffffffffff00,
                       (ImVec2 *)&stack0xfffffffffffffee8);
        uVar20 = false;
        if (((uVar24 & 0x1000000) != 0) &&
           (in_stack_fffffffffffffe2e = true, uVar20 = in_stack_fffffffffffffe2e,
           in_RDI->ScrollingRectMinX <= in_stack_fffffffffffffef0)) {
          in_stack_fffffffffffffe2e =
               in_RDI->ScrollingRectMaxX <= local_108 && local_108 != in_RDI->ScrollingRectMaxX;
          uVar20 = in_stack_fffffffffffffe2e;
        }
        is_contents_visible = uVar20;
        if ((bool)uVar20 != false) {
          fVar16 = ImMax<float>(in_stack_fffffffffffffef0,in_RDI->ScrollingRectMinX);
          ImVec2::ImVec2(&local_124,fVar16,in_stack_fffffffffffffef4 - 1.0);
          ImVec2::ImVec2(&local_12c,in_RDI->ScrollingRectMaxX,in_stack_fffffffffffffefc);
          PushClipRect((ImVec2 *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       &in_stack_fffffffffffffe18->Min,SUB41(in_stack_fffffffffffffe14 >> 0x18,0));
        }
        IVar4 = (pIVar25->DC).CursorMaxPos;
        ImRect::GetSize((ImRect *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        ItemSize((ImVec2 *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (float)((ulong)in_stack_fffffffffffffe18 >> 0x20));
        (pIVar25->DC).CursorMaxPos = IVar4;
        bVar13 = ItemAdd((ImRect *)
                         CONCAT17(uVar20,CONCAT16(in_stack_fffffffffffffe2e,
                                                  CONCAT24(in_stack_fffffffffffffe2c,
                                                           in_stack_fffffffffffffe28))),
                         in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,
                         in_stack_fffffffffffffe14);
        if (bVar13) {
          bVar13 = ButtonBehavior((ImRect *)in_stack_fffffffffffffe80,IVar23,out_hovered,
                                  (bool *)CONCAT17(bVar22,in_stack_fffffffffffffe68),flags_00);
          if ((bVar13) && (bVar15)) {
            in_RDI->NextSelectedTabId = IVar10;
          }
          if (pIVar7->ActiveId != IVar10) {
            SetItemAllowOverlap();
          }
          if (((((local_146 & 1) != 0) && (!bVar5)) &&
              (bVar9 = IsMouseDragging((ImGuiMouseButton)in_stack_fffffffffffffe00,
                                       in_stack_fffffffffffffdfc), bVar9)) &&
             (((pIVar7->DragDropActive & 1U) == 0 && ((in_RDI->Flags & 1U) != 0)))) {
            pIVar1 = &(pIVar7->IO).MouseDelta;
            if ((0.0 < pIVar1->x || pIVar1->x == 0.0) ||
               (in_stack_fffffffffffffef0 <= (pIVar7->IO).MousePos.x)) {
              if ((0.0 < (pIVar7->IO).MouseDelta.x) && (local_108 < (pIVar7->IO).MousePos.x)) {
                in_stack_fffffffffffffea8 = (pIVar7->IO).MousePos;
                TabBarQueueReorderFromMousePos
                          (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                           in_stack_fffffffffffffe40);
              }
            }
            else {
              in_stack_fffffffffffffeb0 = (pIVar7->IO).MousePos;
              TabBarQueueReorderFromMousePos
                        (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                         in_stack_fffffffffffffe40);
            }
          }
          button = (ImGuiMouseButton)((ulong)in_stack_fffffffffffffe00 >> 0x20);
          bb_00 = pIVar25->DrawList;
          if (((local_146 & 1) == 0) && ((local_145 & 1) == 0)) {
            if (local_1 == false) {
              in_stack_fffffffffffffe24 = 0x24;
              if (bVar14) {
                in_stack_fffffffffffffe24 = 0x21;
              }
            }
            else {
              in_stack_fffffffffffffe24 = 0x25;
              if (bVar14) {
                in_stack_fffffffffffffe24 = 0x23;
              }
            }
          }
          id_00 = GetColorU32(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10);
          TabItemBackground((ImDrawList *)in_stack_fffffffffffffeb0,
                            (ImRect *)in_stack_fffffffffffffea8,
                            (ImGuiTabItemFlags)((ulong)bb_00 >> 0x20),(ImU32)bb_00);
          RenderNavHighlight((ImRect *)bb_00,id_00,in_stack_fffffffffffffe98);
          bVar9 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffe10);
          if ((bVar9) &&
             (((bVar9 = IsMouseClicked(0,false), bVar9 || (bVar9 = IsMouseReleased(button), bVar9))
              && (bVar15)))) {
            in_RDI->NextSelectedTabId = IVar10;
          }
          if (local_20 != (byte *)0x0) {
            GetIDWithSeed((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                          (char *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
          }
          IVar4.y = in_stack_ffffffffffffff14;
          IVar4.x = in_stack_ffffffffffffff10;
          TabItemLabelAndCloseButton
                    (in_stack_ffffffffffffff08,(ImRect *)IVar18,
                     (ImGuiTabItemFlags)in_stack_fffffffffffffefc,IVar4,
                     (char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (ImGuiID)IVar19.y,(ImGuiID)IVar19.x,(bool)is_contents_visible,
                     (bool *)CONCAT44(uVar24,in_stack_ffffffffffffff28),(bool *)IVar17);
          if (((local_16d & 1) != 0) && (local_20 != (byte *)0x0)) {
            *local_20 = 0;
            TabBarCloseTab(in_RDI,local_78);
          }
          if ((is_contents_visible & 1) != 0) {
            PopClipRect();
          }
          (pIVar25->DC).CursorPos = IVar17;
          if ((((local_16e & 1) != 0) && (pIVar7->HoveredId == IVar10)) &&
             (((local_146 & 1) == 0 &&
              ((((in_RDI->Flags & 0x20U) == 0 && ((local_78->Flags & 0x10U) == 0)) &&
               (bVar9 = IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffe10), bVar9)))))) {
            pcVar12 = FindRenderedTextEnd(in_RSI,(char *)0x0);
            SetTooltip("%.*s",(ulong)(uint)((int)pcVar12 - (int)in_RSI),in_RSI);
          }
          if (!bVar15) {
            local_1 = bVar13;
          }
        }
        else {
          if ((is_contents_visible & 1) != 0) {
            PopClipRect();
          }
          (pIVar25->DC).CursorPos = IVar17;
        }
      }
      else {
        ImRect::ImRect((ImRect *)in_stack_fffffffffffffe00);
        ItemAdd((ImRect *)
                CONCAT17(in_stack_fffffffffffffe2f,
                         CONCAT16(in_stack_fffffffffffffe2e,
                                  CONCAT24(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28))),
                in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
        if (!bVar15) {
          local_1 = false;
        }
      }
    }
    else {
      ImRect::ImRect((ImRect *)in_stack_fffffffffffffe00);
      ItemAdd((ImRect *)
              CONCAT17(in_stack_fffffffffffffe2f,
                       CONCAT16(in_stack_fffffffffffffe2e,
                                CONCAT24(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28))),
              in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    ImGuiContext& g = *GImGui;
    if (tab_bar->WantLayout)
    {
        ImGuiNextItemData backup_next_item_data = g.NextItemData;
        TabBarLayout(tab_bar);
        g.NextItemData = backup_next_item_data;
    }
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    if (p_open && !*p_open)
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav);
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab_bar->TabsAddedNew = tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, (p_open != NULL) || (flags & ImGuiTabItemFlags_UnsavedDocument));
    tab->RequestedWidth = -1.0f;
    if (g.NextItemData.Flags & ImGuiNextItemDataFlags_HasWidth)
        size.x = tab->RequestedWidth = g.NextItemData.Width;
    if (tab_is_new)
        tab->Width = ImMax(1.0f, size.x);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool tab_just_unsaved = (flags & ImGuiTabItemFlags_UnsavedDocument) && !(tab->Flags & ImGuiTabItemFlags_UnsavedDocument);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS32)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (!is_tab_button)
    {
        if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
            if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
        if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // _SetSelected can only be passed on explicit tab bar
            tab_bar->NextSelectedTabId = id;
    }

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav);
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, tab_just_unsaved ? (flags & ~ImGuiTabItemFlags_UnsavedDocument) : flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip
    // (Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer-> seems ok)
    // (We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar, which g.HoveredId ignores)
    // FIXME: This is a mess.
    // FIXME: We may want disabled tab to still display the tooltip?
    if (text_clipped && g.HoveredId == id && !held)
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            if (IsItemHovered(ImGuiHoveredFlags_DelayNormal))
                SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}